

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.cpp
# Opt level: O2

bool __thiscall idx2::path::operator==(path *this,path *Other)

{
  bool bVar1;
  bool bVar2;
  path *Lhs;
  long lVar3;
  
  if (this->NParts == Other->NParts) {
    lVar3 = -1;
    Lhs = this;
    do {
      lVar3 = lVar3 + 1;
      bVar2 = this->NParts <= lVar3;
      if (this->NParts <= lVar3) {
        return bVar2;
      }
      bVar1 = operator!=(Lhs->Parts,Other->Parts);
      Other = (path *)(Other->Parts + 1);
      Lhs = (path *)(Lhs->Parts + 1);
    } while (!bVar1);
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool
path::operator==(const path& Other) const
{
  if (this->NParts != Other.NParts)
    return false;
  for (int I = 0; I < this->NParts; ++I)
  {
    if (this->Parts[I] != Other.Parts[I])
      return false;
  }
  return true;
}